

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseCompiler::setStackSize
          (BaseCompiler *this,uint32_t virtId,uint32_t newSize,uint32_t newAlignment)

{
  long lVar1;
  long lVar2;
  ConstPoolNode *pCVar3;
  uint32_t uVar4;
  Error EVar5;
  undefined4 in_register_0000000c;
  void *data;
  uint extraout_EDX;
  uint uVar6;
  size_t in_R8;
  ConstPoolNode **out;
  uint auStack_38 [2];
  uint *puVar7;
  
  data = (void *)CONCAT44(in_register_0000000c,newAlignment);
  uVar6 = virtId - 0x100;
  puVar7 = (uint *)(ulong)uVar6;
  if (*(uint *)&this->field_0x1f0 <= uVar6) {
    return 0x1e;
  }
  if ((newAlignment & newAlignment - 1) != 0) {
    EVar5 = BaseEmitter::reportError((BaseEmitter *)this,2,(char *)0x0);
    return EVar5;
  }
  uVar4 = 0x40;
  if (newAlignment < 0x40) {
    uVar4 = newAlignment;
  }
  if (uVar6 < *(uint *)&this->field_0x1f0) {
    lVar1 = *(long *)(*(long *)&this->_vRegArray + (ulong)uVar6 * 8);
    if (newSize != 0) {
      *(uint32_t *)(lVar1 + 8) = newSize;
    }
    if (newAlignment != 0) {
      *(char *)(lVar1 + 0xc) = (char)uVar4;
    }
    if (*(long *)(lVar1 + 0x28) == 0) {
      return 0;
    }
    lVar2 = *(long *)(*(long *)(lVar1 + 0x28) + 0x18);
    if (lVar2 == 0) {
      return 0;
    }
    *(undefined4 *)(lVar2 + 4) = *(undefined4 *)(lVar1 + 8);
    *(undefined1 *)(lVar2 + 1) = *(undefined1 *)(lVar1 + 0xc);
    return 0;
  }
  setStackSize();
  puVar7[0] = 2;
  puVar7[1] = 0;
  puVar7[2] = 0;
  puVar7[3] = 0;
  if (1 < extraout_EDX) {
    EVar5 = BaseEmitter::reportError((BaseEmitter *)this,2,(char *)0x0);
    return EVar5;
  }
  out = this->_constPools + extraout_EDX;
  if ((*out == (ConstPoolNode *)0x0) &&
     (EVar5 = BaseBuilder::newConstPoolNode(&this->super_BaseBuilder,out), EVar5 != 0)) {
    return EVar5;
  }
  pCVar3 = *out;
  EVar5 = ConstPool::add((ConstPool *)(pCVar3 + 0x38),data,in_R8,(size_t *)auStack_38);
  if (EVar5 == 0) {
    uVar6 = *(uint *)(pCVar3 + 0x30);
    *puVar7 = (int)in_R8 << 0x18 | 10;
    puVar7[1] = uVar6;
    puVar7[2] = 0;
    puVar7[3] = auStack_38[0];
    EVar5 = 0;
  }
  else {
    EVar5 = BaseEmitter::reportError((BaseEmitter *)this,EVar5,(char *)0x0);
  }
  return EVar5;
}

Assistant:

Error BaseCompiler::setStackSize(uint32_t virtId, uint32_t newSize, uint32_t newAlignment) {
  if (!isVirtIdValid(virtId))
    return DebugUtils::errored(kErrorInvalidVirtId);

  if (newAlignment && !Support::isPowerOf2(newAlignment))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (newAlignment > 64)
    newAlignment = 64;

  VirtReg* vReg = virtRegById(virtId);
  if (newSize)
    vReg->_virtSize = newSize;

  if (newAlignment)
    vReg->_alignment = uint8_t(newAlignment);

  // This is required if the RAPass is already running. There is a chance that a stack-slot has been already
  // allocated and in that case it has to be updated as well, otherwise we would allocate wrong amount of memory.
  RAWorkReg* workReg = vReg->_workReg;
  if (workReg && workReg->_stackSlot) {
    workReg->_stackSlot->_size = vReg->_virtSize;
    workReg->_stackSlot->_alignment = vReg->_alignment;
  }

  return kErrorOk;
}